

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::io::(anonymous_namespace)::Fixed16Case,int>::
IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>>::AdvanceIfEnd<0ul>
          (IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>> *this)

{
  __tuple_element_t<0UL,_tuple<ParamIterator<Fixed16Case>,_ParamIterator<int>_>_> *this_00;
  __tuple_element_t<0UL,_tuple<ParamIterator<Fixed16Case>,_ParamIterator<int>_>_> *other;
  size_t NextI;
  bool last;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_local;
  
  this_00 = std::
            get<0ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,testing::internal::ParamIterator<int>>
                      ((tuple<testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
                        *)(this + 0x30));
  other = std::
          get<0ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,testing::internal::ParamIterator<int>>
                    ((tuple<testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,_testing::internal::ParamIterator<int>_>
                      *)(this + 0x20));
  ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>::operator!=(this_00,other)
  ;
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }